

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closed_file_input_source.cc
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  ClosedFileInputSource cf2;
  FileInputSource f;
  ClosedFileInputSource cf;
  
  std::operator<<((ostream *)&std::cout,"testing with ClosedFileInputSource\n");
  ClosedFileInputSource::ClosedFileInputSource(&cf,"input");
  do_tests(&cf.super_InputSource);
  std::operator<<((ostream *)&std::cout,"testing with ClosedFileInputSource in stay open mode\n");
  ClosedFileInputSource::ClosedFileInputSource(&cf2,"input");
  ClosedFileInputSource::stayOpen(&cf2,true);
  do_tests(&cf2.super_InputSource);
  ClosedFileInputSource::stayOpen(&cf2,false);
  std::operator<<((ostream *)&std::cout,"testing with FileInputSource\n");
  FileInputSource::FileInputSource(&f,"input");
  do_tests(&f.super_InputSource);
  poVar1 = std::operator<<((ostream *)&std::cout,"all assertions passed");
  std::endl<char,std::char_traits<char>>(poVar1);
  FileInputSource::~FileInputSource(&f);
  ClosedFileInputSource::~ClosedFileInputSource(&cf2);
  ClosedFileInputSource::~ClosedFileInputSource(&cf);
  return 0;
}

Assistant:

int
main()
{
    // This test is designed to work with a specified input file.
    std::cout << "testing with ClosedFileInputSource\n";
    ClosedFileInputSource cf("input");
    do_tests(&cf);
    std::cout << "testing with ClosedFileInputSource in stay open mode\n";
    ClosedFileInputSource cf2("input");
    cf2.stayOpen(true);
    do_tests(&cf2);
    cf2.stayOpen(false);
    std::cout << "testing with FileInputSource\n";
    FileInputSource f("input");
    do_tests(&f);
    std::cout << "all assertions passed" << std::endl;
    return 0;
}